

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

Instr * __thiscall
LowererMDArch::LowerWasmArrayBoundsCheck(LowererMDArch *this,Instr *instr,Opnd *addrOpnd)

{
  RegOpnd *src1;
  Opnd *compareSrc2;
  Lowerer *pLVar1;
  code *pcVar2;
  bool bVar3;
  IndirOpnd *pIVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  LabelInstr *target;
  LabelInstr *target_00;
  LabelInstr *pLVar6;
  Int64ConstOpnd *src2;
  Int64ConstOpnd *dst;
  IntConstOpnd *pIVar7;
  
  pIVar4 = IR::Opnd::AsIndirOpnd(addrOpnd);
  src1 = pIVar4->m_indexOpnd;
  if ((src1 == (RegOpnd *)0x0) || (((src1->super_Opnd).m_type & ~TyInt64) == TyInt32)) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    bVar3 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(this_00);
    if (!bVar3) {
      if (instr->m_src2 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x462,"(instr->GetSrc2())","instr->GetSrc2()");
        if (!bVar3) goto LAB_005cd87c;
        *puVar5 = 0;
      }
      target = Lowerer::InsertLabel(true,instr);
      target_00 = Lowerer::InsertLabel(false,instr);
      pLVar6 = Lowerer::InsertLabel(false,instr);
      compareSrc2 = instr->m_src2;
      src2 = IR::Int64ConstOpnd::New
                       ((long)TySize[addrOpnd->m_type] + (ulong)(uint)pIVar4->m_offset,TyInt64,
                        this->m_func);
      if (src1 != (RegOpnd *)0x0) {
        dst = (Int64ConstOpnd *)IR::RegOpnd::New(TyInt64,this->m_func);
        Lowerer::InsertAdd(true,(Opnd *)dst,&src1->super_Opnd,&src2->super_Opnd,&target->super_Instr
                          );
        src2 = dst;
      }
      Lowerer::InsertCompareBranch
                (this->lowererMD->m_lowerer,&src2->super_Opnd,compareSrc2,BrGt_A,true,target,
                 &target->super_Instr,false);
      pLVar1 = this->lowererMD->m_lowerer;
      pIVar7 = IR::IntConstOpnd::New(-0x7ff5e497,TyInt32,this->m_func,false);
      Lowerer::GenerateThrow(pLVar1,&pIVar7->super_Opnd,&target_00->super_Instr);
      Lowerer::InsertBranch(Br,target_00,&target->super_Instr);
      instr = &pLVar6->super_Instr;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x459,"((0))","UNREACHED");
    if (!bVar3) {
LAB_005cd87c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pLVar1 = this->lowererMD->m_lowerer;
    pIVar7 = IR::IntConstOpnd::New(-0x7ff5e497,TyInt32,this->m_func,false);
    Lowerer::GenerateThrow(pLVar1,&pIVar7->super_Opnd,instr);
  }
  return &((LabelInstr *)instr)->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerWasmArrayBoundsCheck(IR::Instr * instr, IR::Opnd *addrOpnd)
{
    IR::IndirOpnd * indirOpnd = addrOpnd->AsIndirOpnd();
    IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
    if (indexOpnd && !indexOpnd->IsIntegral32())
    {
        // We don't expect the index to be anything other than an int32 or uint32
        // Having an int32 index guaranties that int64 index add doesn't overflow
        // If we're wrong, just throw index out of range
        Assert(UNREACHED);
        lowererMD->m_lowerer->GenerateThrow(IR::IntConstOpnd::New(WASMERR_ArrayIndexOutOfRange, TyInt32, m_func), instr);
        return instr;
    }
    if (m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        return instr;
    }

    Assert(instr->GetSrc2());
    IR::LabelInstr * helperLabel = Lowerer::InsertLabel(true, instr);
    IR::LabelInstr * loadLabel = Lowerer::InsertLabel(false, instr);
    IR::LabelInstr * doneLabel = Lowerer::InsertLabel(false, instr);

    // Find array buffer length
    uint32 offset = indirOpnd->GetOffset();
    IR::Opnd *arrayLenOpnd = instr->GetSrc2();
    IR::Int64ConstOpnd * constOffsetOpnd = IR::Int64ConstOpnd::New((int64)addrOpnd->GetSize() + (int64)offset, TyInt64, m_func);
    IR::Opnd *cmpOpnd;
    if (indexOpnd != nullptr)
    {
        // Compare index + memop access length and array buffer length, and generate RuntimeError if greater
        cmpOpnd = IR::RegOpnd::New(TyInt64, m_func);
        Lowerer::InsertAdd(true, cmpOpnd, indexOpnd, constOffsetOpnd, helperLabel);
    }
    else
    {
        cmpOpnd = constOffsetOpnd;
    }
    lowererMD->m_lowerer->InsertCompareBranch(cmpOpnd, arrayLenOpnd, Js::OpCode::BrGt_A, true, helperLabel, helperLabel);
    lowererMD->m_lowerer->GenerateThrow(IR::IntConstOpnd::New(WASMERR_ArrayIndexOutOfRange, TyInt32, m_func), loadLabel);
    Lowerer::InsertBranch(Js::OpCode::Br, loadLabel, helperLabel);
    return doneLabel;
}